

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detectionoutput.cpp
# Opt level: O3

int __thiscall
ncnn::DetectionOutput::forward
          (DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  BBoxRect *pBVar1;
  vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *this_00;
  vector<float,std::allocator<float>> *this_01;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  pointer pMVar7;
  void *pvVar8;
  unsigned_long uVar9;
  iterator __position;
  iterator __position_00;
  Mat *this_02;
  size_t sVar10;
  bool bVar11;
  pointer pfVar12;
  DetectionOutput *pDVar13;
  size_type sVar14;
  pointer pvVar15;
  int iVar16;
  int *piVar17;
  long lVar18;
  float *pfVar19;
  float *pfVar20;
  pointer pfVar21;
  long lVar22;
  BBoxRect *pBVar23;
  int iVar24;
  uint uVar25;
  size_type sVar26;
  size_type sVar27;
  long lVar28;
  float *pfVar29;
  ulong uVar30;
  ulong uVar31;
  float fVar32;
  float fVar33;
  undefined4 extraout_XMM0_Db;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<float,_std::allocator<float>_> class_bbox_scores;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_class_bbox_scores;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  all_class_bbox_rects;
  vector<float,_std::allocator<float>_> local_1c8;
  vector<float,_std::allocator<float>_> local_1a8;
  int local_18c;
  unsigned_long *local_188;
  iterator iStack_180;
  unsigned_long *local_178;
  DetectionOutput *local_168;
  unsigned_long local_160;
  vector<float,_std::allocator<float>_> local_158;
  ulong local_140;
  size_type local_138;
  uint local_12c;
  undefined8 local_128;
  void *local_118;
  pointer local_110;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_108;
  long local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_c8;
  Option *local_c0;
  long local_b8;
  long local_b0;
  float *local_a8;
  void *local_a0;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_98;
  Mat local_78;
  
  pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_18c = this->num_class;
  if (local_18c == -0xe9) {
    uVar25 = pMVar7[2].h;
  }
  else {
    iVar24 = pMVar7[2].w;
    iVar16 = iVar24 + 3;
    if (-1 < iVar24) {
      iVar16 = iVar24;
    }
    uVar25 = iVar16 >> 2;
  }
  piVar17 = &this->num_class;
  if (local_18c == -0xe9) {
    piVar17 = &pMVar7[1].h;
  }
  local_138 = (size_type)*piVar17;
  local_78.cstep = 0;
  local_78.data = (float *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  local_168 = this;
  Mat::create(&local_78,4,uVar25,4,opt->workspace_allocator);
  pDVar13 = local_168;
  iVar24 = -100;
  if (((float *)local_78.data != (float *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
    pvVar8 = pMVar7[2].data;
    if (local_18c == -0xe9) {
      local_118 = (void *)0x0;
    }
    else {
      local_118 = (void *)((long)pMVar7[2].w * pMVar7[2].elemsize + (long)pvVar8);
    }
    local_140 = (ulong)uVar25;
    local_12c = uVar25;
    local_110 = pMVar7;
    local_c8 = top_blobs;
    local_c0 = opt;
    if (0 < (int)uVar25) {
      local_a0 = pMVar7->data;
      local_a8 = local_168->variances;
      sVar27 = 1;
      if (local_18c != -0xe9) {
        sVar27 = local_138;
      }
      pfVar20 = (float *)pMVar7[1].data;
      lVar22 = (long)local_78.w * CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
      lVar18 = local_140 << 4;
      lVar28 = 0;
      pfVar29 = (float *)local_78.data;
      local_b8 = lVar18;
      local_b0 = lVar22;
      do {
        if (*pfVar20 < 1.0 - pDVar13->confidence_threshold) {
          pfVar19 = (float *)((long)local_118 + lVar28);
          if (local_118 == (void *)0x0) {
            pfVar19 = local_a8;
          }
          local_d8 = CONCAT44((float)((ulong)*(undefined8 *)((long)local_a0 + lVar28) >> 0x20) *
                              (float)((ulong)*(undefined8 *)pfVar19 >> 0x20),
                              (float)*(undefined8 *)((long)local_a0 + lVar28) *
                              (float)*(undefined8 *)pfVar19);
          uStack_d0 = 0;
          uVar5 = *(undefined8 *)((long)local_a0 + lVar28 + 8);
          fVar33 = (float)((ulong)uVar5 >> 0x20) *
                   (float)((ulong)*(undefined8 *)(pfVar19 + 2) >> 0x20);
          local_e8 = CONCAT44(fVar33,(float)uVar5 * (float)*(undefined8 *)(pfVar19 + 2));
          uStack_e0 = 0;
          fVar33 = expf(fVar33);
          local_128 = CONCAT44(extraout_XMM0_Db,fVar33);
          fVar33 = expf((float)local_e8);
          pfVar19 = (float *)((long)pvVar8 + lVar28);
          fVar35 = pfVar19[2] - *pfVar19;
          fVar36 = pfVar19[3] - pfVar19[1];
          fVar32 = (*pfVar19 + pfVar19[2]) * 0.5 + fVar35 * (float)local_d8;
          fVar34 = (pfVar19[1] + pfVar19[3]) * 0.5 + fVar36 * local_d8._4_4_;
          fVar33 = fVar33 * fVar35 * 0.5;
          fVar35 = (float)local_128 * fVar36 * 0.5;
          *pfVar29 = fVar32 - fVar33;
          pfVar29[1] = fVar34 - fVar35;
          pfVar29[2] = fVar32 + fVar33;
          pfVar29[3] = fVar34 + fVar35;
          lVar18 = local_b8;
          lVar22 = local_b0;
        }
        pfVar20 = pfVar20 + sVar27;
        lVar28 = lVar28 + 0x10;
        pfVar29 = (float *)((long)pfVar29 + lVar22);
      } while (lVar18 != lVar28);
    }
    sVar27 = local_138;
    local_98.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize(&local_98,local_138);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&local_108,sVar27);
    if ((int)sVar27 < 2) {
      local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
    }
    else {
      sVar26 = 1;
      if (local_18c == -0xe9) {
        sVar27 = 1;
      }
      uVar30 = 1;
      if (local_18c == -0xe9) {
        uVar30 = local_140;
      }
      local_128 = uVar30 << 2;
      local_e8 = local_128;
      do {
        uVar30 = local_140;
        local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (float *)0x0;
        local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (float *)0x0;
        if (0 < (int)local_12c) {
          uVar31 = 0;
          lVar18 = local_128;
          do {
            fVar33 = *(float *)((long)local_110[1].data + lVar18);
            local_188 = (unsigned_long *)CONCAT44(local_188._4_4_,fVar33);
            if (local_168->confidence_threshold <= fVar33 &&
                fVar33 != local_168->confidence_threshold) {
              lVar22 = (long)local_78.w * uVar31 *
                       CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
              local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(*(undefined4 *)((long)local_78.data + lVar22 + 4),
                                     *(float *)((long)local_78.data + lVar22));
              local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)CONCAT44(*(undefined4 *)((long)local_78.data + lVar22 + 0xc),
                                     *(undefined4 *)((long)local_78.data + lVar22 + 8));
              local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)CONCAT44(local_1a8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                     (int)sVar26);
              if (local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
                _M_realloc_insert<ncnn::BBoxRect_const&>
                          ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_1c8,
                           (iterator)
                           local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(BBoxRect *)&local_1a8);
              }
              else {
                *(int *)((long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish + 0x10) = (int)sVar26;
                *(pointer *)
                 local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish =
                     local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
                *(pointer *)
                 ((long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish + 8) =
                     local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     (pointer)((long)local_1c8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish + 0x14);
              }
              if (local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&local_158,
                           (iterator)
                           local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)&local_188);
              }
              else {
                *local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_188._0_4_;
                local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            uVar31 = uVar31 + 1;
            lVar18 = lVar18 + sVar27 * 4;
          } while (uVar30 != uVar31);
        }
        qsort_descent_inplace<ncnn::BBoxRect>
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_1c8,&local_158)
        ;
        pDVar13 = local_168;
        iVar24 = local_168->nms_top_k;
        iVar16 = (int)((ulong)((long)local_1c8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        if (SBORROW4(iVar24,iVar16 * -0x33333333) != iVar24 + iVar16 * 0x33333333 < 0) {
          std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                    ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_1c8,
                     (long)iVar24);
          std::vector<float,_std::allocator<float>_>::resize(&local_158,(long)pDVar13->nms_top_k);
        }
        pfVar12 = local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pfVar21 = local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_188 = (unsigned_long *)0x0;
        iStack_180._M_current = (unsigned_long *)0x0;
        local_178 = (unsigned_long *)0x0;
        local_d8 = CONCAT44(local_d8._4_4_,pDVar13->nms_threshold);
        uVar30 = ((long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
        std::vector<float,_std::allocator<float>_>::vector
                  (&local_1a8,uVar30,(allocator_type *)&local_160);
        if (pfVar12 != pfVar21) {
          pfVar20 = (float *)((long)local_1c8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8);
          lVar18 = 0;
          do {
            uVar4 = ((BBoxRect *)(pfVar20 + -2))->xmin;
            uVar6 = ((BBoxRect *)(pfVar20 + -2))->ymin;
            local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[lVar18] =
                 ((float)((ulong)*(undefined8 *)pfVar20 >> 0x20) - (float)uVar6) *
                 ((float)*(undefined8 *)pfVar20 - (float)uVar4);
            lVar18 = lVar18 + 1;
            pfVar20 = pfVar20 + 5;
          } while (uVar30 + (uVar30 == 0) != lVar18);
          local_160 = 0;
          do {
            uVar25 = (uint)((ulong)((long)iStack_180._M_current - (long)local_188) >> 3);
            if ((int)uVar25 < 1) {
LAB_002a5e43:
              if (iStack_180._M_current == local_178) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_188,
                           iStack_180,&local_160);
              }
              else {
                *iStack_180._M_current = local_160;
                iStack_180._M_current = iStack_180._M_current + 1;
              }
            }
            else {
              pBVar23 = (BBoxRect *)
                        ((long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start + local_160 * 0x14);
              fVar33 = pBVar23->xmin;
              bVar11 = true;
              uVar31 = 0;
              do {
                uVar9 = local_188[uVar31];
                fVar32 = ((BBoxRect *)
                         ((long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start + uVar9 * 0x14))->xmax;
                fVar34 = 0.0;
                if (fVar33 <= fVar32) {
                  pBVar1 = (BBoxRect *)
                           ((long)local_1c8.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + uVar9 * 0x14);
                  fVar35 = pBVar23->xmax;
                  fVar36 = pBVar1->xmin;
                  if (fVar36 <= fVar35) {
                    fVar2 = pBVar23->ymin;
                    fVar37 = pBVar1->ymax;
                    if (fVar2 <= fVar37) {
                      fVar3 = pBVar23->ymax;
                      fVar38 = pBVar1->ymin;
                      if (fVar38 <= fVar3) {
                        if (fVar35 <= fVar32) {
                          fVar32 = fVar35;
                        }
                        if (fVar36 <= fVar33) {
                          fVar36 = fVar33;
                        }
                        if (fVar3 <= fVar37) {
                          fVar37 = fVar3;
                        }
                        if (fVar38 <= fVar2) {
                          fVar38 = fVar2;
                        }
                        fVar34 = (fVar37 - fVar38) * (fVar32 - fVar36);
                      }
                    }
                  }
                }
                if ((float)local_d8 <
                    fVar34 / ((local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start[local_160] - fVar34) +
                             local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar9])) {
                  bVar11 = false;
                }
                uVar31 = uVar31 + 1;
              } while ((uVar25 & 0x7fffffff) != uVar31);
              if (bVar11) goto LAB_002a5e43;
            }
            local_160 = local_160 + 1;
          } while (local_160 < uVar30);
        }
        if (local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (iStack_180._M_current != local_188) {
          uVar30 = 0;
          do {
            uVar9 = local_188[uVar30];
            pBVar23 = (BBoxRect *)
                      ((long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start + uVar9 * 0x14);
            this_00 = (vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)
                      (local_98.
                       super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + sVar26);
            __position._M_current = *(BBoxRect **)(this_00 + 8);
            if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
              std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
              _M_realloc_insert<ncnn::BBoxRect_const&>(this_00,__position,pBVar23);
            }
            else {
              (__position._M_current)->label = pBVar23->label;
              fVar33 = pBVar23->ymin;
              fVar32 = pBVar23->xmax;
              fVar34 = pBVar23->ymax;
              (__position._M_current)->xmin = pBVar23->xmin;
              (__position._M_current)->ymin = fVar33;
              (__position._M_current)->xmax = fVar32;
              (__position._M_current)->ymax = fVar34;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x14;
            }
            this_01 = (vector<float,std::allocator<float>> *)
                      (local_108.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + sVar26);
            __position_00._M_current = *(float **)(this_01 + 8);
            if (__position_00._M_current == *(float **)(this_01 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (this_01,__position_00,
                         local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar9);
            }
            else {
              *__position_00._M_current =
                   local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9];
              *(float **)(this_01 + 8) = __position_00._M_current + 1;
            }
            uVar30 = uVar30 + 1;
          } while (uVar30 < (ulong)((long)iStack_180._M_current - (long)local_188 >> 3));
        }
        if (local_188 != (unsigned_long *)0x0) {
          operator_delete(local_188,(long)local_178 - (long)local_188);
        }
        sVar14 = local_138;
        if (local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((BBoxRect *)
            local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (BBoxRect *)0x0) {
          operator_delete(local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        sVar26 = sVar26 + 1;
        local_128 = local_128 + local_e8;
      } while (sVar26 != sVar14);
      local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      if (1 < (int)sVar14) {
        lVar18 = 0;
        do {
          pvVar15 = local_108.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>>
                    ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_1a8,
                     local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     *(undefined8 *)
                      ((long)&local_98.
                              super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].
                              super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar18),
                     *(undefined8 *)
                      ((long)&local_98.
                              super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].
                              super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                              _M_impl.super__Vector_impl_data._M_finish + lVar18));
          std::vector<float,std::allocator<float>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                    ((vector<float,std::allocator<float>> *)&local_1c8,
                     local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     *(undefined8 *)
                      ((long)&pvVar15[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar18),
                     *(undefined8 *)
                      ((long)&pvVar15[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_finish + lVar18));
          lVar18 = lVar18 + 0x18;
        } while (sVar14 * 0x18 + -0x18 != lVar18);
      }
    }
    qsort_descent_inplace<ncnn::BBoxRect>
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_1a8,&local_1c8);
    pDVar13 = local_168;
    iVar24 = local_168->keep_top_k;
    iVar16 = (int)((ulong)((long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                          (long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2);
    uVar25 = iVar16 * -0x33333333;
    if (SBORROW4(iVar24,uVar25) != iVar24 + iVar16 * 0x33333333 < 0) {
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_1a8,(long)iVar24)
      ;
      std::vector<float,_std::allocator<float>_>::resize(&local_1c8,(long)pDVar13->keep_top_k);
      uVar25 = (int)((ulong)((long)local_1a8.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_1a8.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2) * -0x33333333;
    }
    iVar24 = 0;
    if (uVar25 != 0) {
      this_02 = (local_c8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_02,6,uVar25,4,local_c0->blob_allocator);
      iVar24 = -100;
      if (((this_02->data != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) &&
         (iVar24 = 0, 0 < (int)uVar25)) {
        iVar16 = this_02->w;
        sVar10 = this_02->elemsize;
        pfVar21 = local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + 4;
        pfVar20 = (float *)((long)this_02->data + 0x14);
        iVar24 = 0;
        uVar30 = 0;
        do {
          fVar33 = local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar30];
          pfVar20[-5] = (float)(int)*pfVar21;
          pfVar20[-4] = fVar33;
          pfVar20[-3] = pfVar21[-4];
          pfVar20[-2] = pfVar21[-3];
          pfVar20[-1] = pfVar21[-2];
          *pfVar20 = pfVar21[-1];
          uVar30 = uVar30 + 1;
          pfVar21 = pfVar21 + 5;
          pfVar20 = (float *)((long)pfVar20 + (long)iVar16 * sVar10);
        } while (uVar25 != uVar30);
      }
    }
    if (local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&local_108);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector(&local_98);
  }
  piVar17 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if ((float *)local_78.data != (float *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar24;
}

Assistant:

int DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& location = bottom_blobs[0];
    const Mat& confidence = bottom_blobs[1];
    const Mat& priorbox = bottom_blobs[2];

    bool mxnet_ssd_style = num_class == -233;

    // mxnet-ssd _contrib_MultiBoxDetection
    const int num_prior = mxnet_ssd_style ? priorbox.h : priorbox.w / 4;

    int num_class_copy = mxnet_ssd_style ? confidence.h : num_class;

    // apply location with priorbox
    Mat bboxes;
    bboxes.create(4, num_prior, 4u, opt.workspace_allocator);
    if (bboxes.empty())
        return -100;

    const float* location_ptr = location;
    const float* priorbox_ptr = priorbox.row(0);
    const float* variance_ptr = mxnet_ssd_style ? 0 : priorbox.row(1);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_prior; i++)
    {
        // if score of background class is larger than confidence threshold
        float score = mxnet_ssd_style ? confidence[i] : confidence[i * num_class_copy];
        if (score >= (1.0 - confidence_threshold))
        {
            continue;
        }
        const float* loc = location_ptr + i * 4;
        const float* pb = priorbox_ptr + i * 4;
        const float* var = variance_ptr ? variance_ptr + i * 4 : variances;

        float* bbox = bboxes.row(i);

        // CENTER_SIZE
        float pb_w = pb[2] - pb[0];
        float pb_h = pb[3] - pb[1];
        float pb_cx = (pb[0] + pb[2]) * 0.5f;
        float pb_cy = (pb[1] + pb[3]) * 0.5f;

        float bbox_cx = var[0] * loc[0] * pb_w + pb_cx;
        float bbox_cy = var[1] * loc[1] * pb_h + pb_cy;
        float bbox_w = static_cast<float>(exp(var[2] * loc[2]) * pb_w);
        float bbox_h = static_cast<float>(exp(var[3] * loc[3]) * pb_h);

        bbox[0] = bbox_cx - bbox_w * 0.5f;
        bbox[1] = bbox_cy - bbox_h * 0.5f;
        bbox[2] = bbox_cx + bbox_w * 0.5f;
        bbox[3] = bbox_cy + bbox_h * 0.5f;
    }

    // sort and nms for each class
    std::vector<std::vector<BBoxRect> > all_class_bbox_rects;
    std::vector<std::vector<float> > all_class_bbox_scores;
    all_class_bbox_rects.resize(num_class_copy);
    all_class_bbox_scores.resize(num_class_copy);

    // start from 1 to ignore background class
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 1; i < num_class_copy; i++)
    {
        // filter by confidence_threshold
        std::vector<BBoxRect> class_bbox_rects;
        std::vector<float> class_bbox_scores;

        for (int j = 0; j < num_prior; j++)
        {
            // prob data layout
            // caffe-ssd = num_class x num_prior
            // mxnet-ssd = num_prior x num_class
            float score = mxnet_ssd_style ? confidence[i * num_prior + j] : confidence[j * num_class_copy + i];

            if (score > confidence_threshold)
            {
                const float* bbox = bboxes.row(j);
                BBoxRect c = {bbox[0], bbox[1], bbox[2], bbox[3], i};
                class_bbox_rects.push_back(c);
                class_bbox_scores.push_back(score);
            }
        }

        // sort inplace
        qsort_descent_inplace(class_bbox_rects, class_bbox_scores);

        // keep nms_top_k
        if (nms_top_k < (int)class_bbox_rects.size())
        {
            class_bbox_rects.resize(nms_top_k);
            class_bbox_scores.resize(nms_top_k);
        }

        // apply nms
        std::vector<size_t> picked;
        nms_sorted_bboxes(class_bbox_rects, picked, nms_threshold);

        // select
        for (size_t j = 0; j < picked.size(); j++)
        {
            size_t z = picked[j];
            all_class_bbox_rects[i].push_back(class_bbox_rects[z]);
            all_class_bbox_scores[i].push_back(class_bbox_scores[z]);
        }
    }

    // gather all class
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (int i = 1; i < num_class_copy; i++)
    {
        const std::vector<BBoxRect>& class_bbox_rects = all_class_bbox_rects[i];
        const std::vector<float>& class_bbox_scores = all_class_bbox_scores[i];

        bbox_rects.insert(bbox_rects.end(), class_bbox_rects.begin(), class_bbox_rects.end());
        bbox_scores.insert(bbox_scores.end(), class_bbox_scores.begin(), class_bbox_scores.end());
    }

    // global sort inplace
    qsort_descent_inplace(bbox_rects, bbox_scores);

    // keep_top_k
    if (keep_top_k < (int)bbox_rects.size())
    {
        bbox_rects.resize(keep_top_k);
        bbox_scores.resize(keep_top_k);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label);
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}